

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  bool bVar1;
  int local_3a8;
  uint local_3a4;
  int i;
  uint32_t bits;
  BrotliBitReader *br_local;
  BrotliDecoderStateInternal *s_local;
  
  do {
    switch(s->substate_metablock_header) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      while (br->bit_pos_ == 0x40) {
        if (br->avail_in == 0) {
          bVar1 = false;
          goto LAB_00103b66;
        }
        br->val_ = br->val_ >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
        br->bit_pos_ = br->bit_pos_ - 8;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 1;
      br->bit_pos_ = br->bit_pos_ + 1;
      bVar1 = true;
LAB_00103b66:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *(ushort *)&s->field_0x13e8 = *(ushort *)&s->field_0x13e8 & 0xfffe | (ushort)(local_3a4 != 0);
      s->meta_block_remaining_len = 0;
      *(ushort *)&s->field_0x13e8 = *(ushort *)&s->field_0x13e8 & 0xfffd;
      *(ushort *)&s->field_0x13e8 = *(ushort *)&s->field_0x13e8 & 0xfffb;
      if ((*(ushort *)&s->field_0x13e8 & 1) == 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
        break;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
      while (br->bit_pos_ == 0x40) {
        if (br->avail_in == 0) {
          bVar1 = false;
          goto LAB_00103de8;
        }
        br->val_ = br->val_ >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
        br->bit_pos_ = br->bit_pos_ - 8;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 1;
      br->bit_pos_ = br->bit_pos_ + 1;
      bVar1 = true;
LAB_00103de8:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (local_3a4 != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
switchD_001039bc_caseD_2:
      while (0x40 - br->bit_pos_ < 2) {
        if (br->avail_in == 0) {
          bVar1 = false;
          goto LAB_00103fe2;
        }
        br->val_ = br->val_ >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
        br->bit_pos_ = br->bit_pos_ - 8;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 3;
      br->bit_pos_ = br->bit_pos_ + 2;
      bVar1 = true;
LAB_00103fe2:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *(ushort *)&s->field_0x13e8 =
           *(ushort *)&s->field_0x13e8 & 0xf00f | ((short)local_3a4 + 4U & 0xff) << 4;
      s->loop_counter = 0;
      if (local_3a4 != 3) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        goto switchD_001039bc_caseD_3;
      }
      *(ushort *)&s->field_0x13e8 = *(ushort *)&s->field_0x13e8 & 0xfffb | 4;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      goto switchD_001039bc_caseD_2;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      goto switchD_001039bc_caseD_3;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      goto switchD_001039bc_caseD_4;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      goto LAB_001045ad;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      goto switchD_001039bc_caseD_6;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      goto switchD_001039bc_caseD_7;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
LAB_001045ad:
  if (br->bit_pos_ != 0x40) goto LAB_0010466c;
  if (br->avail_in == 0) {
    bVar1 = false;
    goto LAB_0010472f;
  }
  br->val_ = br->val_ >> 8;
  br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
  br->bit_pos_ = br->bit_pos_ - 8;
  br->avail_in = br->avail_in - 1;
  br->next_in = br->next_in + 1;
  goto LAB_001045ad;
LAB_0010466c:
  local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 1;
  br->bit_pos_ = br->bit_pos_ + 1;
  bVar1 = true;
LAB_0010472f:
  if (!bVar1) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  if (local_3a4 != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
switchD_001039bc_caseD_6:
  do {
    if (1 < 0x40 - br->bit_pos_) {
      local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 3;
      br->bit_pos_ = br->bit_pos_ + 2;
      bVar1 = true;
LAB_00104918:
      if (!bVar1) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (local_3a4 == 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      *(ushort *)&s->field_0x13e8 =
           *(ushort *)&s->field_0x13e8 & 0xf00f | ((ushort)local_3a4 & 0xff) << 4;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
switchD_001039bc_caseD_7:
      local_3a8 = s->loop_counter;
      do {
        if ((int)(uint)(*(ushort *)&s->field_0x13e8 >> 4 & 0xff) <= local_3a8) {
          s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        while (0x40 - br->bit_pos_ < 8) {
          if (br->avail_in == 0) {
            bVar1 = false;
            goto LAB_00104b7c;
          }
          br->val_ = br->val_ >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
          br->bit_pos_ = br->bit_pos_ - 8;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
        }
        local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 0xff;
        br->bit_pos_ = br->bit_pos_ + 8;
        bVar1 = true;
LAB_00104b7c:
        if (!bVar1) {
          s->loop_counter = local_3a8;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (((local_3a8 + 1U == (uint)(*(ushort *)&s->field_0x13e8 >> 4 & 0xff)) &&
            (1 < (*(ushort *)&s->field_0x13e8 >> 4 & 0xff))) && (local_3a4 == 0)) {
          return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
        }
        s->meta_block_remaining_len =
             local_3a4 << ((byte)(local_3a8 << 3) & 0x1f) | s->meta_block_remaining_len;
        local_3a8 = local_3a8 + 1;
      } while( true );
    }
    if (br->avail_in == 0) {
      bVar1 = false;
      goto LAB_00104918;
    }
    br->val_ = br->val_ >> 8;
    br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
    br->bit_pos_ = br->bit_pos_ - 8;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
  } while( true );
switchD_001039bc_caseD_3:
  for (local_3a8 = s->loop_counter; local_3a8 < (int)(uint)(*(ushort *)&s->field_0x13e8 >> 4 & 0xff)
      ; local_3a8 = local_3a8 + 1) {
    while (0x40 - br->bit_pos_ < 4) {
      if (br->avail_in == 0) {
        bVar1 = false;
        goto LAB_0010426a;
      }
      br->val_ = br->val_ >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
      br->bit_pos_ = br->bit_pos_ - 8;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 0xf;
    br->bit_pos_ = br->bit_pos_ + 4;
    bVar1 = true;
LAB_0010426a:
    if (!bVar1) {
      s->loop_counter = local_3a8;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (((local_3a8 + 1U == (uint)(*(ushort *)&s->field_0x13e8 >> 4 & 0xff)) &&
        (4 < (*(ushort *)&s->field_0x13e8 >> 4 & 0xff))) && (local_3a4 == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
    }
    s->meta_block_remaining_len =
         local_3a4 << ((byte)(local_3a8 << 2) & 0x1f) | s->meta_block_remaining_len;
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
switchD_001039bc_caseD_4:
  if ((*(ushort *)&s->field_0x13e8 & 1) == 0) {
    while (br->bit_pos_ == 0x40) {
      if (br->avail_in == 0) {
        bVar1 = false;
        goto LAB_00104500;
      }
      br->val_ = br->val_ >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | br->val_;
      br->bit_pos_ = br->bit_pos_ - 8;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    local_3a4 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f)) & 1;
    br->bit_pos_ = br->bit_pos_ + 1;
    bVar1 = true;
LAB_00104500:
    if (!bVar1) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    *(ushort *)&s->field_0x13e8 =
         *(ushort *)&s->field_0x13e8 & 0xfffd | (ushort)(local_3a4 != 0) << 1;
  }
  s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(
    BrotliDecoderState* s, BrotliBitReader* br) {
  uint32_t bits;
  int i;
  for (;;) {
    switch (s->substate_metablock_header) {
      case BROTLI_STATE_METABLOCK_HEADER_NONE:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->is_last_metablock = bits ? 1 : 0;
        s->meta_block_remaining_len = 0;
        s->is_uncompressed = 0;
        s->is_metadata = 0;
        if (!s->is_last_metablock) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->size_nibbles = (uint8_t)(bits + 4);
        s->loop_counter = 0;
        if (bits == 3) {
          s->is_metadata = 1;
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_SIZE:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 4, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
            return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 4));
        }
        s->substate_metablock_header =
            BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
        if (!s->is_last_metablock) {
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          s->is_uncompressed = bits ? 1 : 0;
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits != 0) {
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_BYTES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits == 0) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->size_nibbles = (uint8_t)bits;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_METADATA:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 8, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
            return BROTLI_FAILURE(
                BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 8));
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}